

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O2

double crnlib::bessel0(double x)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  iVar1 = 1;
  dVar3 = 1.0;
  dVar4 = 1.0;
  for (dVar2 = 1.0; dVar2 * 1e-16 < dVar4; dVar2 = dVar2 + dVar4) {
    dVar3 = dVar3 * ((x * 0.5) / (double)iVar1);
    dVar4 = dVar3 * dVar3;
    iVar1 = iVar1 + 1;
  }
  return dVar2;
}

Assistant:

static double bessel0(double x)
    {
        const double EPSILON_RATIO = 1E-16;
        double xh, sum, pow, ds;
        int k;

        xh = 0.5 * x;
        sum = 1.0;
        pow = 1.0;
        k = 0;
        ds = 1.0;
        while (ds > sum * EPSILON_RATIO) // FIXME: Shouldn't this stop after X iterations for max. safety?
        {
            ++k;
            pow = pow * (xh / k);
            ds = pow * pow;
            sum = sum + ds;
        }

        return sum;
    }